

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O2

string * __thiscall
google::protobuf::StringPiece::ToString_abi_cxx11_(string *__return_storage_ptr__,StringPiece *this)

{
  char *pcVar1;
  long lVar2;
  
  pcVar1 = this->ptr_;
  if (pcVar1 == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    lVar2 = this->length_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + lVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string ToString() const {
    if (ptr_ == NULL) return string();
    return string(data(), size());
  }